

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment.h
# Opt level: O3

void __thiscall Comment::~Comment(Comment *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->link)._M_dataplus._M_p;
  paVar2 = &(this->link).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->fullName)._M_dataplus._M_p;
  paVar2 = &(this->fullName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->author)._M_dataplus._M_p;
  paVar2 = &(this->author).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->body)._M_dataplus._M_p;
  paVar2 = &(this->body).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->threadId)._M_dataplus._M_p;
  paVar2 = &(this->threadId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->parentId)._M_dataplus._M_p;
  paVar2 = &(this->parentId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->id)._M_dataplus._M_p;
  paVar2 = &(this->id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Comment(const Json& json) {
			id = json["id"].get<std::string>();

			body = replaceHtmlSymbols(json["body"].get<std::string>());
			str::replace_all(body, "\\_", "_");

			author = json["author"].get<std::string>();

			created = json["created"].get<size_t>();

			fullName = json["name"].get<std::string>();

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();

			const std::string parentId_entry = json["parent_id"].get<std::string>();
			parentId = parentId_entry.substr(3); // t1_[...], t3_[...]
			isTopLevelComment = str::starts_with(parentId_entry, "t3_");

			const std::string threadId_entry = json["link_id"].get<std::string>();
			threadId = threadId_entry.substr(3); // t3_[...]
		}